

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O1

int __thiscall QAbstractScrollAreaPrivate::init(QAbstractScrollAreaPrivate *this,EVP_PKEY_CTX *ctx)

{
  QWidget *parent;
  QScrollBar *pQVar1;
  QAbstractScrollAreaScrollBarContainer *pQVar2;
  QObject *pQVar3;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar4;
  long in_FS_OFFSET;
  QAnyStringView QVar5;
  QAnyStringView QVar6;
  QAnyStringView QVar7;
  QAnyStringView QVar8;
  Connection CStack_58;
  QObject local_50 [8];
  QObject local_48 [8];
  QObject local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  parent = *(QWidget **)&(this->super_QFramePrivate).super_QWidgetPrivate.field_0x8;
  aVar4.m_data = operator_new(0x28);
  QWidget::QWidget((QWidget *)aVar4.m_data,parent,(WindowFlags)0x0);
  this->viewport = (QWidget *)aVar4;
  QVar5.m_size = (size_t)"qt_scrollarea_viewport";
  QVar5.field_0.m_data = aVar4.m_data;
  QObject::setObjectName(QVar5);
  QWidget::setBackgroundRole(this->viewport,Base);
  QWidget::setAutoFillBackground(this->viewport,true);
  aVar4.m_data = operator_new(0x40);
  QAbstractScrollAreaScrollBarContainer::QAbstractScrollAreaScrollBarContainer
            ((QAbstractScrollAreaScrollBarContainer *)aVar4.m_data,Horizontal,parent);
  (this->scrollBarContainers).m_data[0] = (QAbstractScrollAreaScrollBarContainer *)aVar4;
  QVar6.m_size = (size_t)"qt_scrollarea_hcontainer";
  QVar6.field_0.m_data = aVar4.m_data;
  QObject::setObjectName(QVar6);
  pQVar1 = (this->scrollBarContainers).m_data[0]->scrollBar;
  this->hbar = pQVar1;
  QAbstractSlider::setRange(&pQVar1->super_QAbstractSlider,0,0);
  pQVar2 = (this->scrollBarContainers).m_data[0];
  (**(code **)(*(long *)&pQVar2->super_QWidget + 0x68))(pQVar2,0);
  QObject::installEventFilter((QObject *)this->hbar);
  QObject::connect(local_40,(char *)this->hbar,(QObject *)"2valueChanged(int)",(char *)parent,
                   0x68172f);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  QObject::connect(local_48,(char *)this->hbar,(QObject *)"2rangeChanged(int,int)",(char *)parent,
                   0x681766);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  aVar4.m_data = operator_new(0x40);
  QAbstractScrollAreaScrollBarContainer::QAbstractScrollAreaScrollBarContainer
            ((QAbstractScrollAreaScrollBarContainer *)aVar4.m_data,Vertical,parent);
  ((anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)((this->scrollBarContainers).m_data + 1))->m_data
       = (void *)aVar4;
  QVar7.m_size = (size_t)"qt_scrollarea_vcontainer";
  QVar7.field_0.m_data = aVar4.m_data;
  QObject::setObjectName(QVar7);
  pQVar1 = (this->scrollBarContainers).m_data[1]->scrollBar;
  this->vbar = pQVar1;
  QAbstractSlider::setRange(&pQVar1->super_QAbstractSlider,0,0);
  pQVar2 = (this->scrollBarContainers).m_data[1];
  (**(code **)(*(long *)&pQVar2->super_QWidget + 0x68))(pQVar2,0);
  QObject::installEventFilter((QObject *)this->vbar);
  QObject::connect(local_50,(char *)this->vbar,(QObject *)"2valueChanged(int)",(char *)parent,
                   0x68173f);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  QObject::connect((QObject *)&CStack_58,(char *)this->vbar,(QObject *)"2rangeChanged(int,int)",
                   (char *)parent,0x681766);
  QMetaObject::Connection::~Connection(&CStack_58);
  aVar4.m_data = operator_new(0x18);
  QObject::QObject((QObject *)aVar4.m_data_utf8,(QObject *)0x0);
  *(undefined ***)aVar4.m_data = &PTR_metaObject_007f8b50;
  *(QAbstractScrollAreaPrivate **)((long)aVar4.m_data + 0x10) = this;
  QVar8.m_size = (size_t)"qt_abstractscrollarea_filter";
  QVar8.field_0.m_data = aVar4.m_data;
  QObject::setObjectName(QVar8);
  pQVar3 = (this->viewportFilter).d;
  if ((pQVar3 != (QObject *)aVar4.m_data) &&
     ((this->viewportFilter).d = (QObject *)aVar4, pQVar3 != (QObject *)0x0)) {
    (**(code **)(*(long *)pQVar3 + 0x20))();
  }
  QObject::installEventFilter(&this->viewport->super_QObject);
  QWidget::setFocusProxy(this->viewport,parent);
  QWidget::setFocusPolicy(parent,StrongFocus);
  QFrame::setFrameStyle((QFrame *)parent,0x36);
  QWidget::setSizePolicy(parent,(QSizePolicy)0x770000);
  layoutChildren(this);
  QWidget::grabGesture(this->viewport,PanGesture,(GestureFlags)0x0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractScrollAreaPrivate::init()
{
    Q_Q(QAbstractScrollArea);
    viewport = new QWidget(q);
    viewport->setObjectName("qt_scrollarea_viewport"_L1);
    viewport->setBackgroundRole(QPalette::Base);
    viewport->setAutoFillBackground(true);
    scrollBarContainers[Qt::Horizontal] = new QAbstractScrollAreaScrollBarContainer(Qt::Horizontal, q);
    scrollBarContainers[Qt::Horizontal]->setObjectName("qt_scrollarea_hcontainer"_L1);
    hbar = scrollBarContainers[Qt::Horizontal]->scrollBar;
    hbar->setRange(0,0);
    scrollBarContainers[Qt::Horizontal]->setVisible(false);
    hbar->installEventFilter(q);
    QObject::connect(hbar, SIGNAL(valueChanged(int)), q, SLOT(_q_hslide(int)));
    QObject::connect(hbar, SIGNAL(rangeChanged(int,int)), q, SLOT(_q_showOrHideScrollBars()), Qt::QueuedConnection);
    scrollBarContainers[Qt::Vertical] = new QAbstractScrollAreaScrollBarContainer(Qt::Vertical, q);
    scrollBarContainers[Qt::Vertical]->setObjectName("qt_scrollarea_vcontainer"_L1);
    vbar = scrollBarContainers[Qt::Vertical]->scrollBar;
    vbar->setRange(0,0);
    scrollBarContainers[Qt::Vertical]->setVisible(false);
    vbar->installEventFilter(q);
    QObject::connect(vbar, SIGNAL(valueChanged(int)), q, SLOT(_q_vslide(int)));
    QObject::connect(vbar, SIGNAL(rangeChanged(int,int)), q, SLOT(_q_showOrHideScrollBars()), Qt::QueuedConnection);
    viewportFilter.reset(new QAbstractScrollAreaFilter(this));
    viewport->installEventFilter(viewportFilter.data());
    viewport->setFocusProxy(q);
    q->setFocusPolicy(Qt::StrongFocus);
    q->setFrameStyle(QFrame::StyledPanel | QFrame::Sunken);
    q->setSizePolicy(QSizePolicy::Expanding, QSizePolicy::Expanding);
    layoutChildren();
#ifndef Q_OS_MACOS
#  ifndef QT_NO_GESTURES
    viewport->grabGesture(Qt::PanGesture);
#  endif
#endif
}